

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O1

void __thiscall
data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
~PriorityQueue(PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this)

{
  size_t *psVar1;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar2;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar3;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *temp_node;
  
  this->_vptr_PriorityQueue = (_func_int **)&PTR__PriorityQueue_0010dc38;
  (this->_list)._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010dc68;
  pLVar3 = (this->_list)._header;
  if (pLVar3 != (this->_list)._tail) {
    do {
      pLVar2 = pLVar3->_next;
      if (pLVar2 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
        pLVar3->_next = pLVar2->_next;
        (*pLVar2->_vptr_ListNode[1])(pLVar2);
      }
      if (pLVar2 == (this->_list)._tail) {
        (this->_list)._tail = pLVar3;
      }
      psVar1 = &(this->_list)._size;
      *psVar1 = *psVar1 - 1;
      pLVar3 = (this->_list)._header;
    } while (pLVar3 != (this->_list)._tail);
  }
  if (pLVar3 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
    (*pLVar3->_vptr_ListNode[1])(pLVar3);
  }
  (this->_list)._header =
       (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0;
  (this->_list)._tail =
       (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0;
  (this->_list)._size = 0;
  operator_delete(this,0x28);
  return;
}

Assistant:

inline
    PriorityQueue<T>::~PriorityQueue() {}